

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::LeafPattern::~LeafPattern(LeafPattern *this)

{
  value *in_RDI;
  
  *(undefined ***)in_RDI = &PTR_flat_003532f0;
  docopt::value::~value(in_RDI);
  std::__cxx11::string::~string((string *)&(in_RDI->variant).strValue);
  return;
}

Assistant:

LeafPattern(std::string name, value v = {})
		: fName(std::move(name)),
		  fValue(std::move(v))
		{}